

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::init
          (SingleVertexArrayOutputTypeGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  OutputType outputType_;
  int t;
  InputType type;
  GLValue max_;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  MultiVertexArrayTest *this_00;
  long *plVar8;
  ulong *puVar9;
  int **ppiVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  undefined8 uVar15;
  bool bVar16;
  long lVar17;
  GLValue GVar18;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_188;
  undefined1 local_180 [16];
  pointer local_170;
  pointer pAStack_168;
  pointer local_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [16];
  int *local_a8;
  long lStack_a0;
  ulong local_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  uVar12 = 0;
  do {
    uVar4 = (int)uVar12 - 6;
    local_78 = uVar12 - 3;
    local_188 = 2;
    do {
      lVar17 = 0;
      bVar2 = true;
      do {
        bVar16 = bVar2;
        typeToString<int>(&local_70,local_188);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1a9adba);
        local_118 = &local_108;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_108 = *plVar8;
          lStack_100 = plVar6[3];
        }
        else {
          local_108 = *plVar8;
          local_118 = (long *)*plVar6;
        }
        local_110 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        local_138 = &local_128;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_128 = *puVar9;
          lStack_120 = plVar6[3];
        }
        else {
          local_128 = *puVar9;
          local_138 = (ulong *)*plVar6;
        }
        local_130 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        outputType_ = (&DAT_01bf39a0)[uVar12];
        deqp::gls::Array::outputTypeToString_abi_cxx11_
                  (&local_d8,(Array *)(ulong)outputType_,(OutputType)local_130);
        uVar13 = 0xf;
        if (local_138 != &local_128) {
          uVar13 = local_128;
        }
        if (uVar13 < local_d8._M_string_length + local_130) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            uVar15 = local_d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_d8._M_string_length + local_130) goto LAB_0116cdc5;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_138);
        }
        else {
LAB_0116cdc5:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)local_d8._M_dataplus._M_p);
        }
        local_180._0_8_ = &local_170;
        ppAVar1 = (pointer *)(puVar7 + 2);
        if ((pointer *)*puVar7 == ppAVar1) {
          local_170 = *ppAVar1;
          pAStack_168 = (pointer)puVar7[3];
        }
        else {
          local_170 = *ppAVar1;
          local_180._0_8_ = (pointer *)*puVar7;
        }
        local_180._8_8_ = puVar7[1];
        *puVar7 = ppAVar1;
        puVar7[1] = 0;
        *(undefined1 *)ppAVar1 = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_180);
        local_b8._0_8_ = &local_a8;
        ppiVar10 = (int **)(plVar6 + 2);
        if ((int **)*plVar6 == ppiVar10) {
          local_a8 = *ppiVar10;
          lStack_a0 = plVar6[3];
        }
        else {
          local_a8 = *ppiVar10;
          local_b8._0_8_ = (int **)*plVar6;
        }
        local_b8._8_8_ = plVar6[1];
        *plVar6 = (long)ppiVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        t = (&DAT_01bc2920)[lVar17];
        typeToString<int>(&local_f8,t);
        piVar14 = (int *)0xf;
        if ((int **)local_b8._0_8_ != &local_a8) {
          piVar14 = local_a8;
        }
        if (piVar14 < (int *)(local_f8._M_string_length + local_b8._8_8_)) {
          uVar15 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar15 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < (int *)(local_f8._M_string_length + local_b8._8_8_))
          goto LAB_0116cf10;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,local_b8._0_8_);
        }
        else {
LAB_0116cf10:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_b8,(ulong)local_f8._M_dataplus._M_p);
        }
        local_158 = &local_148;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_148 = *plVar6;
          uStack_140 = puVar7[3];
        }
        else {
          local_148 = *plVar6;
          local_158 = (long *)*puVar7;
        }
        local_150 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_b8._0_8_ != &local_a8) {
          operator_delete((void *)local_b8._0_8_,(long)local_a8 + 1);
        }
        if ((pointer *)local_180._0_8_ != &local_170) {
          operator_delete((void *)local_180._0_8_,(ulong)((long)&local_170->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        type = this->m_type;
        uVar5 = 0x9f >> ((byte)type & 0x1f);
        bVar3 = (byte)uVar5 | INPUTTYPE_UNSIGNED_INT < type;
        if ((type < INPUTTYPE_UNSIGNED_INT_2_10_10_10) && ((0x203U >> (type & 0x1f) & 1) != 0)) {
          if ((uVar12 < 3) &&
             (uVar4 < 0xfffffffd || ((uVar5 & 1) != 0 || INPUTTYPE_UNSIGNED_INT < type)))
          goto LAB_0116d0cc;
        }
        else if ((type & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10 || 5 < local_78) {
          bVar11 = INPUTTYPE_INT < type | 0x67U >> ((byte)type & 0x1f);
          if (type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            if ((~((uVar4 < 0xfffffffd | bVar3) & (uVar12 < 6 | bVar11)) & 1) == 0 && local_188 == 4
               ) {
LAB_0116d0cc:
              GVar18 = deqp::gls::GLValue::getMinValue(type);
              aStack_38 = GVar18.field_1;
              local_40 = GVar18.type;
              GVar18 = deqp::gls::GLValue::getMaxValue(this->m_type);
              aStack_48 = GVar18.field_1;
              local_50 = GVar18.type;
              max_._4_4_ = uStack_4c;
              max_.type = local_50;
              GVar18._4_4_ = uStack_3c;
              GVar18.type = local_40;
              GVar18.field_1 = aStack_38;
              max_.field_1 = aStack_48;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        ((ArraySpec *)local_b8,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                         local_188,0,0,false,GVar18,max_);
              local_170 = (pointer)0x0;
              pAStack_168 = (pointer)0x0;
              local_160 = (pointer)0x0;
              local_180._4_4_ = t;
              local_180._0_4_ = 1;
              local_180._8_8_ = local_180._8_8_ & 0xffffffff00000000;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
              ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                        ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                          *)&local_170,(iterator)0x0,(ArraySpec *)local_b8);
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                         (Spec *)local_180,(char *)local_158,(char *)local_158);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              if (local_170 != (pointer)0x0) {
                operator_delete(local_170,(long)local_160 - (long)local_170);
              }
            }
          }
          else if ((byte)((uVar12 < 6 | bVar11) &
                          (type != INPUTTYPE_INT_2_10_10_10 || local_188 == 4) &
                         (uVar4 < 0xfffffffd | bVar3)) != 0) goto LAB_0116d0cc;
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        lVar17 = 1;
        bVar2 = false;
      } while (bVar16);
      local_188 = local_188 + 1;
    } while (local_188 != 5);
    uVar12 = uVar12 + 1;
    if (uVar12 == 9) {
      return 5;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayOutputTypeGroup::init (void)
{
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4, Array::OUTPUTTYPE_IVEC2, Array::OUTPUTTYPE_IVEC3, Array::OUTPUTTYPE_IVEC4, Array::OUTPUTTYPE_UVEC2, Array::OUTPUTTYPE_UVEC3, Array::OUTPUTTYPE_UVEC4 };
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					std::string name = "components" + typeToString(componentCount) + "_" + Array::outputTypeToString(outputTypes[outputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

					const bool inputIsSignedInteger		= m_type == Array::INPUTTYPE_INT || m_type == Array::INPUTTYPE_SHORT || m_type == Array::INPUTTYPE_BYTE;
					const bool inputIsUnignedInteger	= m_type == Array::INPUTTYPE_UNSIGNED_INT || m_type == Array::INPUTTYPE_UNSIGNED_SHORT || m_type == Array::INPUTTYPE_UNSIGNED_BYTE;
					const bool outputIsSignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC4;
					const bool outputIsUnsignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC4;

					// If input type is float type and output type is int type skip
					if ((m_type == Array::INPUTTYPE_FLOAT ||  m_type == Array::INPUTTYPE_HALF || m_type == Array::INPUTTYPE_FIXED) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					// Loading signed data as unsigned causes undefined values and vice versa
					if (inputIsSignedInteger && outputIsUnsignedInteger)
						continue;
					if (inputIsUnignedInteger && outputIsSignedInteger)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	outputTypes[outputTypeNdx],
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}